

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protodec.c
# Opt level: O3

void protodec_generate_nmea(demod_state_t *d,int bufferlen,int fillbits,time_t received_t)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  byte bVar8;
  byte bVar9;
  long lVar10;
  byte *pbVar11;
  byte bVar12;
  ulong uVar13;
  bool bVar14;
  
  bVar12 = 1;
  if (0x150 < bufferlen) {
    bVar12 = ((char)((ulong)((uint)bufferlen >> 4) / 0x15) + '\x01') -
             (((uint)(bufferlen * 0x3cf3cf3d) >> 4 | bufferlen * -0x30000000) < 0xc30c31);
  }
  bVar14 = 1 < bVar12;
  bVar5 = 1;
  if (bVar14) {
    bVar5 = bVar12;
  }
  uVar3 = (ulong)(bVar14 + 0xe);
  bVar8 = 0;
  lVar7 = 0;
  do {
    uVar4 = uVar3;
    uVar13 = uVar3;
    if ((int)lVar7 < bufferlen) {
      lVar7 = (long)(int)lVar7;
      do {
        uVar2 = 0;
        lVar10 = -6;
        bVar6 = 5;
        do {
          uVar2 = uVar2 | (uint)d->rbuffer[lVar10 + lVar7 + 6] << (bVar6 & 0x1f);
          bVar6 = bVar6 - 1;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0);
        d->nmea[uVar13] = (char)uVar2 + (0x27 < (uVar2 & 0xf8)) * '\b' + '0';
        lVar7 = lVar7 + 6;
        uVar13 = uVar13 + 1;
      } while ((uVar13 < (bVar14 | 0x46)) && (lVar7 < bufferlen));
      uVar4 = uVar13 & 0xffffffff;
    }
    bVar8 = bVar8 + 1;
    builtin_strncpy(d->nmea,"!AIVDM,0,0,",0xb);
    d->nmea[7] = d->nmea[7] + bVar12;
    d->nmea[9] = d->nmea[9] + bVar8;
    builtin_strncpy(d->nmea + uVar4,",0*00",6);
    if (bVar12 < 2) {
      d->nmea[0xb] = ',';
      d->nmea[0xc] = d->chanid;
      d->nmea[0xd] = ',';
    }
    else {
      d->nmea[0xb] = d->seqnr + '0';
      d->nmea[0xc] = ',';
      d->nmea[0xd] = d->chanid;
      d->nmea[0xe] = ',';
      if (bVar8 == bVar12) {
        d->nmea[uVar4 + 1] = (char)fillbits + '0';
      }
    }
    pcVar1 = d->nmea;
    bVar6 = pcVar1[1];
    bVar9 = pcVar1[2];
    if (bVar9 != 0x2a) {
      pbVar11 = (byte *)(pcVar1 + 3);
      do {
        bVar6 = bVar6 ^ bVar9;
        bVar9 = *pbVar11;
        pbVar11 = pbVar11 + 1;
      } while (bVar9 != 0x2a);
    }
    sprintf(pcVar1 + uVar4 + 3,"%02X\r\n",(ulong)bVar6);
    if (on_nmea_sentence_received != (decoder_on_nmea_sentence_received)0x0) {
      (*on_nmea_sentence_received)(d->nmea,(int)uVar13 + 7,bVar12,bVar8);
    }
  } while (bVar8 != bVar5);
  return;
}

Assistant:

void protodec_generate_nmea(struct demod_state_t *d, int bufferlen, int fillbits, time_t received_t)
{
	int senlen;
	int pos;
    int k, offset;
	int m;
    unsigned char sentences, sentencenum, nmeachk, letter;
	
	//6bits to nmea-ascii. One sentence len max 82char
	//inc. head + tail.This makes inside datamax 62char multipart, 62 single
    senlen = 56;		//this is normally not needed.For testing only. May be fixed number
    if (bufferlen <= (senlen * 6)) {
		sentences = 1;
	} else {
		sentences = bufferlen / (senlen * 6);
		//sentences , if overflow put one more
		if (bufferlen % (senlen * 6) != 0)
			sentences++;
	};

    sentencenum = 0;
	pos = 0;
    offset = (sentences>1) ? 15 : 14;
	do {
        k = offset;		//leave room for nmea header
        while (k < senlen + offset && bufferlen > pos) {
            letter = (unsigned char)protodec_henten(pos, 6, d->rbuffer);
			// 6bit-to-ascii conversion by IEC
            letter += (letter < 40) ? 48 : 56;
			d->nmea[k] = letter;
			pos += 6;
			k++;
		}
		sentencenum++;
		
        memcpy(&d->nmea[0], "!AIVDM,0,0,", 11);
        d->nmea[7] += sentences;
        d->nmea[9] += sentencenum;

        memcpy(&d->nmea[k], ",0*00\0", 6);
		
		if (sentences > 1) {
            d->nmea[11] = '0' + d->seqnr;
            d->nmea[12] = ',';
            d->nmea[13] = d->chanid;
            d->nmea[14] = ',';
            if (sentencenum == sentences) d->nmea[k + 1] = '0' + fillbits;
        } else {
            d->nmea[11] = ',';
            d->nmea[12] = d->chanid;
            d->nmea[13] = ',';
		}

        m = 1;
        nmeachk = d->nmea[m++];
        while (d->nmea[m] != '*') nmeachk ^= d->nmea[m++];

        sprintf(&d->nmea[k + 3], "%02X\r\n", nmeachk);
        if (on_nmea_sentence_received != NULL)
            on_nmea_sentence_received(d->nmea, k+7, sentences, sentencenum);
    } while (sentencenum < sentences);
}